

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O2

void CB_EXPLORE_ADF::predict_or_learn_cover<true>
               (cb_explore_adf *data,multi_learner *base,multi_ex *examples)

{
  label *this;
  uint uVar1;
  example *peVar2;
  pointer pfVar3;
  action_score *paVar4;
  bool bVar5;
  uint32_t i_2;
  long lVar6;
  ulong uVar7;
  size_t sVar8;
  size_t i_1;
  size_t sVar9;
  uint32_t i;
  float fVar10;
  cb_explore_adf *pcVar11;
  uint32_t j;
  ulong uVar12;
  ulong uVar13;
  polyprediction *preds;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar19;
  undefined1 auVar20 [16];
  float fVar21;
  undefined4 in_XMM2_Db;
  float local_c8;
  float local_b8;
  wclass local_98;
  undefined8 local_88;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  float local_78;
  v_array<COST_SENSITIVE::label> *local_68;
  v_array<CB::label> *local_60;
  ulong local_58;
  score_iterator local_50;
  score_iterator local_40;
  undefined1 auVar18 [16];
  
  if ((data->gen_cs).cb_type == 3) {
    GEN_CS::gen_cs_example_dr<true>(&data->gen_cs,examples,&data->cs_labels);
  }
  else {
    GEN_CS::gen_cs_example<false>(&data->gen_cs,examples,&data->cs_labels);
  }
  fVar10 = 0.0;
  LEARNER::multiline_learn_or_predict<true>(base,examples,data->offset,0);
  peVar2 = *(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar13 = (long)(peVar2->pred).scalars._end - (long)(peVar2->pred).scalars._begin >> 3;
  uVar12 = data->cover_size;
  local_78 = (float)(uVar13 & 0xffffffff);
  lVar6 = (uVar13 & 0xffffffff) * data->counter;
  auVar20._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar20._0_8_ = lVar6;
  auVar20._12_4_ = 0x45300000;
  auVar15._8_8_ = auVar20._8_8_ - 1.9342813113834067e+25;
  preds = &peVar2->pred;
  auVar15._0_8_ =
       SQRT(auVar15._8_8_ + ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0));
  auVar16._4_12_ = auVar15._4_12_;
  auVar16._0_4_ = (float)auVar15._0_8_;
  auVar18._0_8_ = auVar16._0_8_;
  auVar18._8_4_ = (int)((ulong)auVar15._0_8_ >> 0x20);
  auVar18._12_4_ = in_XMM2_Db;
  auVar17._8_8_ = auVar18._8_8_;
  auVar17._4_4_ = local_78;
  auVar17._0_4_ = auVar16._0_4_;
  auVar20 = divps(_DAT_0024f110,auVar17);
  uStack_80 = auVar20._4_4_;
  local_88 = (cb_explore_adf *)CONCAT44(uStack_80,uStack_80);
  pcVar11 = data;
  uStack_7c = uStack_80;
  v_array<ACTION_SCORE::action_score>::clear(&data->action_probs);
  for (; (float)uVar13 != fVar10; fVar10 = (float)((int)fVar10 + 1)) {
    local_98.class_index = 0;
    pcVar11 = data;
    local_98.x = fVar10;
    v_array<ACTION_SCORE::action_score>::push_back(&data->action_probs,(action_score *)&local_98);
  }
  pfVar3 = (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar3) {
    (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_finish = pfVar3;
  }
  fVar10 = 1.0 / (float)uVar12;
  local_b8 = auVar20._0_4_;
  if ((float)local_88 <= local_b8) {
    local_b8 = (float)local_88;
  }
  local_88 = (cb_explore_adf *)&data->scores;
  uVar13 = uVar13 & 0xffffffff;
  for (lVar6 = 0; uVar13 * 8 - lVar6 != 0; lVar6 = lVar6 + 8) {
    pcVar11 = local_88;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)local_88,
               (value_type_conflict2 *)((long)&((preds->a_s)._begin)->score + lVar6));
  }
  if (data->first_only == false) {
    sVar8 = fill_tied(pcVar11,(v_array<ACTION_SCORE::action_score> *)&preds->scalars);
    for (sVar9 = 0; sVar8 != sVar9; sVar9 = sVar9 + 1) {
      uVar1 = (preds->a_s)._begin[sVar9].action;
      paVar4 = (data->action_probs)._begin;
      paVar4[uVar1].score = paVar4[uVar1].score + fVar10 / (float)sVar8;
    }
  }
  else {
    uVar1 = ((preds->a_s)._begin)->action;
    paVar4 = (data->action_probs)._begin;
    paVar4[uVar1].score = paVar4[uVar1].score + fVar10;
  }
  bVar5 = CB::ec_is_example_header
                    (*(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                      super__Vector_impl_data._M_start);
  local_78 = local_78 * local_b8;
  local_c8 = (fVar10 - local_b8) + local_78;
  this = &data->cs_labels_2;
  local_60 = &data->cb_labels;
  local_68 = &data->prepped_cs_labels;
  uVar12 = 1;
  while (uVar12 < data->cover_size) {
    local_58 = uVar12;
    v_array<COST_SENSITIVE::wclass>::clear(&this->costs);
    if (bVar5) {
      v_array<COST_SENSITIVE::wclass>::push_back(&this->costs,(data->cs_labels).costs._begin);
    }
    for (uVar12 = 0; uVar13 != uVar12; uVar12 = uVar12 + 1) {
      local_98.class_index = (uint32_t)uVar12;
      fVar14 = (data->action_probs)._begin[uVar12].score;
      fVar19 = local_b8;
      if (local_b8 <= fVar14) {
        fVar19 = fVar14;
      }
      local_98.x = (data->cs_labels).costs._begin[local_98.class_index + bVar5].x -
                   (data->psi * local_b8) / (fVar19 / local_c8);
      local_98.partial_prediction = 0.0;
      local_98.wap_value = 0.0;
      v_array<COST_SENSITIVE::wclass>::push_back(&this->costs,&local_98);
    }
    pcVar11 = (cb_explore_adf *)data->cs_ldf_learner;
    uVar12 = local_58 + 1;
    GEN_CS::call_cs_ldf<true>
              ((multi_learner *)pcVar11,examples,local_60,this,local_68,data->offset,uVar12);
    for (uVar7 = 0; uVar13 != uVar7; uVar7 = uVar7 + 1) {
      pfVar3 = (((_Vector_impl *)&(local_88->action_probs)._begin)->super__Vector_impl_data).
               _M_start;
      pfVar3[uVar7] = (preds->a_s)._begin[uVar7].score + pfVar3[uVar7];
    }
    if (data->first_only == false) {
      sVar8 = fill_tied(pcVar11,(v_array<ACTION_SCORE::action_score> *)&preds->scalars);
      fVar14 = fVar10 / (float)sVar8;
      for (sVar9 = 0; sVar8 != sVar9; sVar9 = sVar9 + 1) {
        uVar1 = (preds->a_s)._begin[sVar9].action;
        paVar4 = (data->action_probs)._begin;
        fVar19 = paVar4[uVar1].score;
        fVar21 = (fVar19 - local_b8) + fVar14;
        uVar7 = (ulong)fVar21;
        local_c8 = local_c8 +
                   (float)(~-(uint)(fVar19 < local_b8) & (uint)fVar14 |
                          (uint)(float)((long)(fVar21 - 9.223372e+18) & (long)uVar7 >> 0x3f | uVar7)
                          & -(uint)(fVar19 < local_b8));
        paVar4[uVar1].score = fVar14 + fVar19;
      }
    }
    else {
      uVar1 = ((preds->a_s)._begin)->action;
      paVar4 = (data->action_probs)._begin;
      fVar14 = paVar4[uVar1].score;
      fVar19 = (fVar14 - local_b8) + fVar10;
      uVar7 = (ulong)fVar19;
      local_c8 = local_c8 +
                 (float)(~-(uint)(fVar14 < local_b8) & (uint)fVar10 |
                        (uint)(float)((long)(fVar19 - 9.223372e+18) & (long)uVar7 >> 0x3f | uVar7) &
                        -(uint)(fVar14 < local_b8));
      paVar4[uVar1].score = fVar10 + fVar14;
    }
  }
  local_40._p = (data->action_probs)._begin;
  local_40._vptr_score_iterator =
       (_func_int **)
       &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_50._p = (data->action_probs)._end;
  local_50._vptr_score_iterator =
       (_func_int **)
       &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  exploration::enforce_minimum_probability<ACTION_SCORE::score_iterator>
            (local_78,(bool)(data->nounif ^ 1),&local_40,&local_50);
  do_sort(data);
  for (uVar12 = 0; uVar13 != uVar12; uVar12 = uVar12 + 1) {
    (preds->a_s)._begin[uVar12] = (data->action_probs)._begin[uVar12];
  }
  data->counter = data->counter + 1;
  return;
}

Assistant:

void predict_or_learn_cover(cb_explore_adf& data, multi_learner& base, multi_ex& examples)
{
  // Randomize over predictions from a base set of predictors
  // Use cost sensitive oracle to cover actions to form distribution.
  const bool is_mtr = data.gen_cs.cb_type == CB_TYPE_MTR;
  if (is_learn)
  {
    if (is_mtr)  // use DR estimates for non-ERM policies in MTR
      GEN_CS::gen_cs_example_dr<true>(data.gen_cs, examples, data.cs_labels);
    else
      GEN_CS::gen_cs_example<false>(data.gen_cs, examples, data.cs_labels);
    multiline_learn_or_predict<true>(base, examples, data.offset);
  }
  else
  {
    GEN_CS::gen_cs_example_ips(examples, data.cs_labels);
    multiline_learn_or_predict<false>(base, examples, data.offset);
  }

  v_array<action_score>& preds = examples[0]->pred.a_s;
  const uint32_t num_actions = (uint32_t)preds.size();

  float additive_probability = 1.f / (float)data.cover_size;
  const float min_prob = min(1.f / num_actions, 1.f / (float)sqrt(data.counter * num_actions));
  v_array<action_score>& probs = data.action_probs;
  probs.clear();
  for (uint32_t i = 0; i < num_actions; i++) probs.push_back({i, 0.});
  data.scores.clear();
  for (uint32_t i = 0; i < num_actions; i++) data.scores.push_back(preds[i].score);

  if (!data.first_only)
  {
    size_t tied_actions = fill_tied(data, preds);
    for (size_t i = 0; i < tied_actions; ++i) probs[preds[i].action].score += additive_probability / tied_actions;
  }
  else
    probs[preds[0].action].score += additive_probability;

  const uint32_t shared = CB::ec_is_example_header(*examples[0]) ? 1 : 0;

  float norm = min_prob * num_actions + (additive_probability - min_prob);
  for (size_t i = 1; i < data.cover_size; i++)
  {
    // Create costs of each action based on online cover
    if (is_learn)
    {
      data.cs_labels_2.costs.clear();
      if (shared > 0)
        data.cs_labels_2.costs.push_back(data.cs_labels.costs[0]);
      for (uint32_t j = 0; j < num_actions; j++)
      {
        float pseudo_cost =
            data.cs_labels.costs[j + shared].x - data.psi * min_prob / (max(probs[j].score, min_prob) / norm);
        data.cs_labels_2.costs.push_back({pseudo_cost, j, 0., 0.});
      }
      GEN_CS::call_cs_ldf<true>(*(data.cs_ldf_learner), examples, data.cb_labels, data.cs_labels_2,
          data.prepped_cs_labels, data.offset, i + 1);
    }
    else
      GEN_CS::call_cs_ldf<false>(
          *(data.cs_ldf_learner), examples, data.cb_labels, data.cs_labels, data.prepped_cs_labels, data.offset, i + 1);

    for (uint32_t i = 0; i < num_actions; i++) data.scores[i] += preds[i].score;
    if (!data.first_only)
    {
      size_t tied_actions = fill_tied(data, preds);
      const float add_prob = additive_probability / tied_actions;
      for (size_t i = 0; i < tied_actions; ++i)
      {
        if (probs[preds[i].action].score < min_prob)
          norm += max(0, add_prob - (min_prob - probs[preds[i].action].score));
        else
          norm += add_prob;
        probs[preds[i].action].score += add_prob;
      }
    }
    else
    {
      uint32_t action = preds[0].action;
      if (probs[action].score < min_prob)
        norm += max(0, additive_probability - (min_prob - probs[action].score));
      else
        norm += additive_probability;
      probs[action].score += additive_probability;
    }
  }

  enforce_minimum_probability(min_prob * num_actions, !data.nounif, begin_scores(probs), end_scores(probs));

  do_sort(data);
  for (size_t i = 0; i < num_actions; i++) preds[i] = probs[i];

  ++data.counter;
}